

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_decode_array(char **data)

{
  byte c_00;
  uint8_t c;
  char **data_local;
  
  c_00 = mp_load_u8(data);
  if ((c_00 & 0x40) == 0) {
    data_local._4_4_ = c_00 & 0xf;
  }
  else {
    data_local._4_4_ = mp_decode_array_slowpath(c_00,data);
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL MP_ALWAYSINLINE uint32_t
mp_decode_array(const char **data)
{
	uint8_t c = mp_load_u8(data);

	if (mp_likely(!(c & 0x40)))
		return (c & 0xf);

	return mp_decode_array_slowpath(c, data);
}